

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O0

aiCamera * __thiscall
Assimp::BlenderImporter::ConvertCamera
          (BlenderImporter *this,Scene *param_1,Object *obj,Camera *cam,ConversionData *param_4)

{
  float fVar1;
  aiCamera *this_00;
  pointer paVar2;
  double dVar3;
  aiVector3t<float> local_68;
  aiVector3t<float> local_5c;
  aiVector3t<float> local_50 [2];
  unique_ptr<aiCamera,_std::default_delete<aiCamera>_> local_38;
  unique_ptr<aiCamera,_std::default_delete<aiCamera>_> out;
  ConversionData *param_4_local;
  Camera *cam_local;
  Object *obj_local;
  Scene *param_1_local;
  BlenderImporter *this_local;
  
  out._M_t.super___uniq_ptr_impl<aiCamera,_std::default_delete<aiCamera>_>._M_t.
  super__Tuple_impl<0UL,_aiCamera_*,_std::default_delete<aiCamera>_>.
  super__Head_base<0UL,_aiCamera_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiCamera,_std::default_delete<aiCamera>,_true,_true>)
       (__uniq_ptr_data<aiCamera,_std::default_delete<aiCamera>,_true,_true>)param_4;
  this_00 = (aiCamera *)operator_new(0x438);
  aiCamera::aiCamera(this_00);
  std::unique_ptr<aiCamera,std::default_delete<aiCamera>>::
  unique_ptr<std::default_delete<aiCamera>,void>
            ((unique_ptr<aiCamera,std::default_delete<aiCamera>> *)&local_38,this_00);
  paVar2 = std::unique_ptr<aiCamera,_std::default_delete<aiCamera>_>::operator->(&local_38);
  aiString::operator=(&paVar2->mName,(obj->id).name + 2);
  aiVector3t<float>::aiVector3t(local_50,0.0,0.0,0.0);
  paVar2 = std::unique_ptr<aiCamera,_std::default_delete<aiCamera>_>::operator->(&local_38);
  (paVar2->mPosition).z = local_50[0].z;
  (paVar2->mPosition).x = local_50[0].x;
  (paVar2->mPosition).y = local_50[0].y;
  aiVector3t<float>::aiVector3t(&local_5c,0.0,1.0,0.0);
  paVar2 = std::unique_ptr<aiCamera,_std::default_delete<aiCamera>_>::operator->(&local_38);
  (paVar2->mUp).z = local_5c.z;
  (paVar2->mUp).x = local_5c.x;
  (paVar2->mUp).y = local_5c.y;
  aiVector3t<float>::aiVector3t(&local_68,0.0,0.0,-1.0);
  paVar2 = std::unique_ptr<aiCamera,_std::default_delete<aiCamera>_>::operator->(&local_38);
  (paVar2->mLookAt).x = local_68.x;
  (paVar2->mLookAt).y = local_68.y;
  (paVar2->mLookAt).z = local_68.z;
  if (((cam->sensor_x != 0.0) || (NAN(cam->sensor_x))) && ((cam->lens != 0.0 || (NAN(cam->lens)))))
  {
    dVar3 = std::atan2((double)(ulong)(uint)cam->sensor_x,
                       (double)(ulong)(uint)(cam->lens + cam->lens));
    paVar2 = std::unique_ptr<aiCamera,_std::default_delete<aiCamera>_>::operator->(&local_38);
    paVar2->mHorizontalFOV = SUB84(dVar3,0) * 2.0;
  }
  fVar1 = cam->clipsta;
  paVar2 = std::unique_ptr<aiCamera,_std::default_delete<aiCamera>_>::operator->(&local_38);
  paVar2->mClipPlaneNear = fVar1;
  fVar1 = cam->clipend;
  paVar2 = std::unique_ptr<aiCamera,_std::default_delete<aiCamera>_>::operator->(&local_38);
  paVar2->mClipPlaneFar = fVar1;
  paVar2 = std::unique_ptr<aiCamera,_std::default_delete<aiCamera>_>::release(&local_38);
  std::unique_ptr<aiCamera,_std::default_delete<aiCamera>_>::~unique_ptr(&local_38);
  return paVar2;
}

Assistant:

aiCamera* BlenderImporter::ConvertCamera(const Scene& /*in*/, const Object* obj, const Camera* cam, ConversionData& /*conv_data*/)
{
    std::unique_ptr<aiCamera> out(new aiCamera());
    out->mName = obj->id.name+2;
    out->mPosition = aiVector3D(0.f, 0.f, 0.f);
    out->mUp = aiVector3D(0.f, 1.f, 0.f);
    out->mLookAt = aiVector3D(0.f, 0.f, -1.f);
    if (cam->sensor_x && cam->lens) {
        out->mHorizontalFOV = 2.f * std::atan2(cam->sensor_x,  2.f * cam->lens);
    }
    out->mClipPlaneNear = cam->clipsta;
    out->mClipPlaneFar = cam->clipend;

    return out.release();
}